

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
* __thiscall
slang::parsing::Preprocessor::getDefinedMacros
          (vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
           *__return_storage_ptr__,Preprocessor *this)

{
  pointer *pppDVar1;
  DefineDirectiveSyntax *pDVar2;
  iterator __position;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  __first;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  __last;
  uint uVar3;
  long lVar4;
  ushort uVar5;
  identity *piVar6;
  identity *piVar7;
  ulong uVar8;
  identity *piVar9;
  less *extraout_RDX;
  identity *extraout_RDX_01;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  _Var10;
  identity *in_R8;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  __i;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  __last_00;
  __normal_iterator<const_slang::syntax::DefineDirectiveSyntax_**,_std::vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>_>
  __lasti;
  table_element_pointer ppVar11;
  char_pointer puVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_00;
  iterator iVar15;
  _Val_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_01;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_02;
  identity *extraout_RDX_00;
  
  (__return_storage_ptr__->
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar15 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
           ::begin(&(this->macros).table_);
  if (iVar15.p_ == (table_element_pointer)0x0) {
    return __return_storage_ptr__;
  }
LAB_002f71dd:
  do {
    pDVar2 = ((iVar15.p_)->second).syntax;
    if (pDVar2 != (DefineDirectiveSyntax *)0x0) {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>
        ::_M_realloc_insert<slang::syntax::DefineDirectiveSyntax_const*const&>
                  ((vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>
                    *)__return_storage_ptr__,__position,&((iVar15.p_)->second).syntax);
      }
      else {
        *__position._M_current = pDVar2;
        pppDVar1 = &(__return_storage_ptr__->
                    super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppDVar1 = *pppDVar1 + 1;
      }
    }
    piVar9 = (identity *)(iVar15.pc_ + 0x12);
    piVar6 = (identity *)(iVar15.pc_ + 2);
    while( true ) {
      piVar7 = piVar6;
      puVar12 = iVar15.pc_;
      ppVar11 = iVar15.p_ + 1;
      if (((uint)iVar15.pc_ & 0xf) == 0xe) break;
      iVar15.p_ = ppVar11;
      iVar15.pc_ = puVar12 + 1;
      piVar9 = piVar9 + 1;
      piVar6 = piVar7 + 1;
      if (piVar7[-1] != (identity)0x0) goto code_r0x002f7231;
    }
    auVar13[0] = -(*piVar7 == (identity)0x0);
    auVar13[1] = -(piVar7[1] == (identity)0x0);
    auVar13[2] = -(piVar7[2] == (identity)0x0);
    auVar13[3] = -(piVar7[3] == (identity)0x0);
    auVar13[4] = -(piVar7[4] == (identity)0x0);
    auVar13[5] = -(piVar7[5] == (identity)0x0);
    auVar13[6] = -(piVar7[6] == (identity)0x0);
    auVar13[7] = -(piVar7[7] == (identity)0x0);
    auVar13[8] = -(piVar7[8] == (identity)0x0);
    auVar13[9] = -(piVar7[9] == (identity)0x0);
    auVar13[10] = -(piVar7[10] == (identity)0x0);
    auVar13[0xb] = -(piVar7[0xb] == (identity)0x0);
    auVar13[0xc] = -(piVar7[0xc] == (identity)0x0);
    auVar13[0xd] = -(piVar7[0xd] == (identity)0x0);
    auVar13[0xe] = -(piVar7[0xe] == (identity)0x0);
    auVar13[0xf] = -(piVar7[0xf] == (identity)0x0);
    uVar5 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe;
    while (uVar5 == 0x7fff) {
      ppVar11 = ppVar11 + 0xf;
      auVar14[0] = -(*piVar9 == (identity)0x0);
      auVar14[1] = -(piVar9[1] == (identity)0x0);
      auVar14[2] = -(piVar9[2] == (identity)0x0);
      auVar14[3] = -(piVar9[3] == (identity)0x0);
      auVar14[4] = -(piVar9[4] == (identity)0x0);
      auVar14[5] = -(piVar9[5] == (identity)0x0);
      auVar14[6] = -(piVar9[6] == (identity)0x0);
      auVar14[7] = -(piVar9[7] == (identity)0x0);
      auVar14[8] = -(piVar9[8] == (identity)0x0);
      auVar14[9] = -(piVar9[9] == (identity)0x0);
      auVar14[10] = -(piVar9[10] == (identity)0x0);
      auVar14[0xb] = -(piVar9[0xb] == (identity)0x0);
      auVar14[0xc] = -(piVar9[0xc] == (identity)0x0);
      auVar14[0xd] = -(piVar9[0xd] == (identity)0x0);
      auVar14[0xe] = -(piVar9[0xe] == (identity)0x0);
      auVar14[0xf] = -(piVar9[0xf] == (identity)0x0);
      piVar7 = piVar9;
      piVar9 = piVar9 + 0x10;
      uVar5 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe;
    }
    uVar3 = 0;
    if ((uVar5 ^ 0x7fff) != 0) {
      for (; ((uVar5 ^ 0x7fff) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    piVar9 = (identity *)(ulong)uVar3;
    if (piVar7[(long)piVar9] == (identity)0x1) goto LAB_002f729c;
    iVar15.p_ = (table_element_pointer)((long)&(ppVar11->first)._M_len + (ulong)(uVar3 << 5));
    iVar15.pc_ = (char_pointer)(piVar7 + (long)piVar9);
  } while( true );
code_r0x002f7231:
  if (piVar7[-1] == (identity)0x1) {
LAB_002f729c:
    __first._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__first._M_current == __last._M_current) {
      return __return_storage_ptr__;
    }
    uVar8 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar4 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    __comp_02._M_comp.__proj = in_R8;
    __comp_02._M_comp.__comp = (less *)piVar9;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<slang::syntax::DefineDirectiveSyntax_const**,std::vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::parsing::Preprocessor::getDefinedMacros()const::__0,std::identity>(slang::parsing::Preprocessor::getDefinedMacros()const::__0&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
              (__first,__last,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,__comp_02);
    if (0x80 < (long)__last._M_current - (long)__first._M_current) {
      __last_00._M_current = __first._M_current + 0x10;
      __comp._M_comp.__proj = piVar9;
      __comp._M_comp.__comp = extraout_RDX;
      _Var10._M_current = __last_00._M_current;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<slang::syntax::DefineDirectiveSyntax_const**,std::vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::parsing::Preprocessor::getDefinedMacros()const::__0,std::identity>(slang::parsing::Preprocessor::getDefinedMacros()const::__0&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                (__first,__last_00,__comp);
      piVar9 = extraout_RDX_00;
      for (; __last_00._M_current != __last._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        __comp_01._M_comp.__proj = piVar9;
        __comp_01._M_comp.__comp = (less *)_Var10._M_current;
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<slang::syntax::DefineDirectiveSyntax_const**,std::vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<std::ranges::__detail::__make_comp_proj<slang::parsing::Preprocessor::getDefinedMacros()const::__0,std::identity>(slang::parsing::Preprocessor::getDefinedMacros()const::__0&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                  (__last_00,__comp_01);
        piVar9 = extraout_RDX_01;
      }
      return __return_storage_ptr__;
    }
    __comp_00._M_comp.__proj = piVar9;
    __comp_00._M_comp.__comp = extraout_RDX;
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<slang::syntax::DefineDirectiveSyntax_const**,std::vector<slang::syntax::DefineDirectiveSyntax_const*,std::allocator<slang::syntax::DefineDirectiveSyntax_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::parsing::Preprocessor::getDefinedMacros()const::__0,std::identity>(slang::parsing::Preprocessor::getDefinedMacros()const::__0&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
              (__first,__last,__comp_00);
    return __return_storage_ptr__;
  }
  iVar15.pc_ = (char_pointer)(piVar7 + -1);
  goto LAB_002f71dd;
}

Assistant:

std::vector<const DefineDirectiveSyntax*> Preprocessor::getDefinedMacros() const {
    std::vector<const DefineDirectiveSyntax*> results;
    for (auto& [name, def] : macros) {
        if (def.syntax)
            results.push_back(def.syntax);
    }

    std::ranges::sort(results, [](const DefineDirectiveSyntax* a, const DefineDirectiveSyntax* b) {
        return a->name.valueText() < b->name.valueText();
    });
    return results;
}